

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

int acutest_check_(int cond,char *file,int line,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar4;
  int color;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (cond == 0) {
    if ((acutest_test_already_logged_ == 0) && (acutest_current_test_ != (acutest_test_ *)0x0)) {
      acutest_finish_test_line_(-1);
    }
    acutest_test_failures_ = acutest_test_failures_ + 1;
    acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
    color = 2;
    pcVar4 = "failed";
    iVar1 = 2;
  }
  else {
    iVar1 = 3;
    color = 1;
    pcVar4 = "ok";
  }
  if (iVar1 <= acutest_verbose_level_) {
    if (acutest_case_name_[0] != '\0' && acutest_case_already_logged_ == 0) {
      acutest_line_indent_(1);
      acutest_colored_printf_(3,"Case %s:\n",acutest_case_name_);
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
      acutest_case_already_logged_ = acutest_case_already_logged_ + 1;
    }
    acutest_line_indent_(2 - (uint)(acutest_case_name_[0] == '\0'));
    if (file != (char *)0x0) {
      pcVar2 = strrchr(file,0x2f);
      pcVar3 = pcVar2 + 1;
      if (pcVar2 == (char *)0x0) {
        pcVar3 = file;
      }
      printf("%s:%d: Check ",pcVar3,(ulong)(uint)line);
    }
    local_f8 = local_e8;
    local_100 = &args[0].overflow_arg_area;
    local_108 = 0x3000000020;
    vprintf(fmt,&local_108);
    printf("... ");
    acutest_colored_printf_(color,"%s",pcVar4);
    putchar(10);
    acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
  }
  acutest_cond_failed_ = (uint)(cond == 0);
  return (uint)(cond != 0);
}

Assistant:

acutest_check_(int cond, const char* file, int line, const char* fmt, ...)
{
    const char *result_str;
    int result_color;
    int verbose_level;

    if(cond) {
        result_str = "ok";
        result_color = ACUTEST_COLOR_GREEN_;
        verbose_level = 3;
    } else {
        if(!acutest_test_already_logged_  &&  acutest_current_test_ != NULL)
            acutest_finish_test_line_(-1);

        result_str = "failed";
        result_color = ACUTEST_COLOR_RED_;
        verbose_level = 2;
        acutest_test_failures_++;
        acutest_test_already_logged_++;
    }

    if(acutest_verbose_level_ >= verbose_level) {
        va_list args;

        if(!acutest_case_already_logged_  &&  acutest_case_name_[0]) {
            acutest_line_indent_(1);
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Case %s:\n", acutest_case_name_);
            acutest_test_already_logged_++;
            acutest_case_already_logged_++;
        }

        acutest_line_indent_(acutest_case_name_[0] ? 2 : 1);
        if(file != NULL) {
#ifdef ACUTEST_WIN_
            const char* lastsep1 = strrchr(file, '\\');
            const char* lastsep2 = strrchr(file, '/');
            if(lastsep1 == NULL)
                lastsep1 = file-1;
            if(lastsep2 == NULL)
                lastsep2 = file-1;
            file = (lastsep1 > lastsep2 ? lastsep1 : lastsep2) + 1;
#else
            const char* lastsep = strrchr(file, '/');
            if(lastsep != NULL)
                file = lastsep+1;
#endif
            printf("%s:%d: Check ", file, line);
        }

        va_start(args, fmt);
        vprintf(fmt, args);
        va_end(args);

        printf("... ");
        acutest_colored_printf_(result_color, "%s", result_str);
        printf("\n");
        acutest_test_already_logged_++;
    }

    acutest_cond_failed_ = (cond == 0);
    return !acutest_cond_failed_;
}